

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

void __thiscall cmDependsFortran::ConsiderModule(cmDependsFortran *this,char *name,char *stampDir)

{
  cmDependsFortranInternals *pcVar1;
  iterator iVar2;
  bool bVar3;
  pointer ppVar4;
  byte local_b9;
  allocator local_89;
  string local_88 [8];
  string stampFile;
  allocator local_49;
  key_type local_48;
  _Self local_28;
  iterator required;
  char *stampDir_local;
  char *name_local;
  cmDependsFortran *this_local;
  
  pcVar1 = this->Internal;
  required._M_node = (_Base_ptr)stampDir;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,name,&local_49);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&pcVar1->TargetRequires,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  stampFile.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->Internal->TargetRequires);
  bVar3 = std::operator!=(&local_28,(_Self *)((long)&stampFile.field_2 + 8));
  local_b9 = 0;
  if (bVar3) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&local_28);
    local_b9 = std::__cxx11::string::empty();
  }
  iVar2._M_node = required._M_node;
  if ((local_b9 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,(char *)iVar2._M_node,&local_89);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::__cxx11::string::operator+=(local_88,"/");
    std::__cxx11::string::operator+=(local_88,name);
    std::__cxx11::string::operator+=(local_88,".mod.stamp");
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_28);
    std::__cxx11::string::operator=((string *)&ppVar4->second,local_88);
    std::__cxx11::string::~string(local_88);
  }
  return;
}

Assistant:

void cmDependsFortran::ConsiderModule(const char* name,
                                      const char* stampDir)
{
  // Locate each required module.
  typedef cmDependsFortranInternals::TargetRequiresMap TargetRequiresMap;
  TargetRequiresMap::iterator required =
    this->Internal->TargetRequires.find(name);
  if(required != this->Internal->TargetRequires.end() &&
     required->second.empty())
    {
    // The module is provided by a CMake target.  It will have a stamp file.
    std::string stampFile = stampDir;
    stampFile += "/";
    stampFile += name;
    stampFile += ".mod.stamp";
    required->second = stampFile;
    }
}